

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<float>::Swap(RepeatedField<float> *this,RepeatedField<float> *other)

{
  ulong uVar1;
  int iVar2;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 aVar3;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 arena;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar4;
  RepeatedField<float> temp;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_28;
  
  if (this != other) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      aVar3.arena = internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      paVar4 = &heap_rep(this)->field_0;
      aVar3 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar4->arena;
    }
    if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      arena.arena = internal::SooRep::soo_arena(&other->soo_rep_);
    }
    else {
      paVar4 = &heap_rep(other)->field_0;
      arena = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar4->arena;
    }
    if (aVar3.arena == arena.arena) {
      InternalSwap(this,other);
      return;
    }
    internal::ShortSooRep::ShortSooRep(&local_28.short_rep,arena.arena);
    if ((local_28.long_rep.elements_int._0_1_ & 4) != 0) {
      internal::LongSooRep::elements(&local_28.long_rep);
    }
    MergeFrom((RepeatedField<float> *)&local_28.long_rep,this);
    uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
    if ((uVar1 & 4) != 0) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if ((iVar2 != 0) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,0);
    MergeFrom(this,other);
    UnsafeArenaSwap(other,(RepeatedField<float> *)&local_28.long_rep);
    ~RepeatedField((RepeatedField<float> *)&local_28.long_rep);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Arena* arena = GetArena();
  Arena* other_arena = other->GetArena();
  if (internal::CanUseInternalSwap(arena, other_arena)) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other_arena);
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}